

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pySRUP.cpp
# Opt level: O2

object get_token(SRUP_MSG *self)

{
  uint16_t uVar1;
  uint8_t *puVar2;
  PyObject *pPVar3;
  SRUP_MSG *in_RSI;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  puVar2 = SRUP_MSG::token(in_RSI);
  if (puVar2 == (uint8_t *)0x0) {
    __Py_NoneStruct = __Py_NoneStruct + 1;
    self->_vptr_SRUP_MSG = (_func_int **)&_Py_NoneStruct;
  }
  else {
    uVar1 = SRUP_MSG::token_length(in_RSI);
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_38,puVar2,puVar2 + uVar1);
    pPVar3 = boost::python::api::object_initializer_impl<false,false>::get<std::__cxx11::string>
                       (local_38);
    self->_vptr_SRUP_MSG = (_func_int **)pPVar3;
    std::__cxx11::string::~string((string *)local_38);
  }
  return (object)(object_base)self;
}

Assistant:

boost::python::object get_token(SRUP_MSG& self)
{
    const uint8_t* rv;
    rv = self.token();
    if (rv!=nullptr)
        return boost::python::object(std::string((char*)rv, self.token_length()));
    else
        return boost::python::object();
}